

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_ssub_u16(c_v64 a,c_v64 b)

{
  short sVar1;
  int c;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local = a;
  b_local = b;
  for (c = 0; c < 4; c = c + 1) {
    if ((int)((uint)*(ushort *)((long)&a_local + (long)c * 2) -
             (uint)*(ushort *)((long)&b_local + (long)c * 2)) < 0) {
      sVar1 = 0;
    }
    else {
      sVar1 = *(short *)((long)&a_local + (long)c * 2) - *(short *)((long)&b_local + (long)c * 2);
    }
    *(short *)((long)&t + (long)c * 2) = sVar1;
  }
  return (c_v64)t.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_ssub_u16(c_v64 a, c_v64 b) {
  c_v64 t;
  int c;
  for (c = 0; c < 4; c++)
    t.u16[c] =
        (int32_t)a.u16[c] - (int32_t)b.u16[c] < 0 ? 0 : a.u16[c] - b.u16[c];
  return t;
}